

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Flt::render(V2Flt *this,float *dest,float *src,int nsamples,int step)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  float fVar4;
  V2LRC flt;
  undefined1 local_58 [16];
  float local_48;
  float local_44;
  V2LRC *local_40;
  long local_38;
  
  switch(this->mode & 7) {
  case 0:
    if (dest == src) {
      return;
    }
    memmove(dest,src,(long)nsamples << 2);
    return;
  case 1:
    local_58._0_8_ = this->lrc;
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      V2LRC::step_2x((V2LRC *)local_58,*(float *)((long)src + uVar2),this->cfreq,this->res);
      *(undefined4 *)((long)dest + uVar2) = local_58._0_4_;
      uVar2 = uVar2 + (long)step * 4;
    }
    break;
  case 2:
    local_58._0_8_ = this->lrc;
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      V2LRC::step_2x((V2LRC *)local_58,*(float *)((long)src + uVar2),this->cfreq,this->res);
      *(undefined4 *)((long)dest + uVar2) = local_58._4_4_;
      uVar2 = uVar2 + (long)step * 4;
    }
    break;
  case 3:
    local_58._0_8_ = this->lrc;
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      fVar4 = V2LRC::step_2x((V2LRC *)local_58,*(float *)((long)src + uVar2),this->cfreq,this->res);
      *(float *)((long)dest + uVar2) = fVar4;
      uVar2 = uVar2 + (long)step * 4;
    }
    break;
  case 4:
    local_58._0_8_ = this->lrc;
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      fVar4 = V2LRC::step_2x((V2LRC *)local_58,*(float *)((long)src + uVar2),this->cfreq,this->res);
      *(float *)((long)dest + uVar2) = fVar4 + (float)local_58._0_4_;
      uVar2 = uVar2 + (long)step * 4;
    }
    break;
  case 5:
    local_58._0_8_ = this->lrc;
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      fVar4 = V2LRC::step_2x((V2LRC *)local_58,*(float *)((long)src + uVar2),this->cfreq,this->res);
      *(float *)((long)dest + uVar2) = (float)local_58._0_4_ + (float)local_58._4_4_ + fVar4;
      uVar2 = uVar2 + (long)step * 4;
    }
    break;
  case 6:
    local_40 = (V2LRC *)&this->moog;
    local_48 = (this->moog).b[4];
    local_58._0_4_ = (this->moog).b[0];
    local_58._4_4_ = (this->moog).b[1];
    local_58._8_8_ = *(V2LRC *)((this->moog).b + 2);
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    local_38 = (long)step << 2;
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      local_44 = *(float *)((long)src + uVar2);
      V2Moog::step((V2Moog *)local_58,local_44,this->moogf,this->moogp,this->moogq);
      fVar4 = V2Moog::step((V2Moog *)local_58,local_44,this->moogf,this->moogp,this->moogq);
      *(float *)((long)dest + uVar2) = fVar4;
      uVar2 = uVar2 + local_38;
    }
    goto LAB_0010b7a6;
  case 7:
    local_40 = (V2LRC *)&this->moog;
    local_48 = (this->moog).b[4];
    local_58._0_4_ = (this->moog).b[0];
    local_58._4_4_ = (this->moog).b[1];
    local_58._8_8_ = *(V2LRC *)((this->moog).b + 2);
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    local_38 = (long)step << 2;
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      local_44 = *(float *)((long)src + uVar2);
      V2Moog::step((V2Moog *)local_58,local_44,this->moogf,this->moogp,this->moogq);
      fVar4 = V2Moog::step((V2Moog *)local_58,local_44,this->moogf,this->moogp,this->moogq);
      *(float *)((long)dest + uVar2) = local_44 - fVar4;
      uVar2 = uVar2 + local_38;
    }
LAB_0010b7a6:
    local_40[2].l = local_48;
    local_40->l = (float)local_58._0_4_;
    local_40->b = (float)local_58._4_4_;
    local_40[1].l = (float)local_58._8_4_;
    local_40[1].b = (float)local_58._12_4_;
    return;
  }
  (this->lrc).l = (float)local_58._0_4_;
  (this->lrc).b = (float)local_58._4_4_;
  return;
}

Assistant:

void render(float *dest, const float *src, int nsamples, int step=1)
    {
        V2LRC flt;
        V2Moog m;

        switch (mode & 7)
        {
        case BYPASS:
            COVER("VCF bypass");
            // @@@BUG ignores step? this is wrong but I suppose this
            // never gets hit for stereo case.
            if (dest != src)
                memmove(dest, src, nsamples * sizeof(float));
            break;

        case LOW:
            COVER("VCF low");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l;
            }
            lrc = flt;
            break;

        case BAND:
            COVER("VCF band");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.b;
            }
            lrc = flt;
            break;

        case HIGH:
            COVER("VCF high");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = h;
            }
            lrc = flt;
            break;

        case NOTCH:
            COVER("VCF notch");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + h;
            }
            lrc = flt;
            break;

        case ALL:
            COVER("VCF all");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + flt.b + h;
            }
            lrc = flt;
            break;

        case MOOGL:
            COVER("VCF moog low");
            // Moog filters are 2x oversampled, so run filter twice.
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;

        case MOOGH:
            COVER("VCF moog high");
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = in - m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;
        }

        DEBUG_PLOT_STRIDED(this, dest, step, nsamples);
    }